

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,Fl_Preferences *parent,char *group)

{
  Fl_Preferences *this_00;
  Node *pNVar1;
  RootNode *this_01;
  char *group_local;
  Fl_Preferences *parent_local;
  Fl_Preferences *this_local;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Preferences_002ecfc8;
  group_local = (char *)parent;
  if (parent == (Fl_Preferences *)0x0) {
    if (runtimePrefs == (Fl_Preferences *)0x0) {
      this_00 = (Fl_Preferences *)operator_new(0x18);
      Fl_Preferences(this_00);
      runtimePrefs = this_00;
      pNVar1 = (Node *)operator_new(0x48);
      Node::Node(pNVar1,".");
      runtimePrefs->node = pNVar1;
      this_01 = (RootNode *)operator_new(0x20);
      RootNode::RootNode(this_01,runtimePrefs);
      runtimePrefs->rootNode = this_01;
      Node::setRoot(runtimePrefs->node,this->rootNode);
    }
    group_local = (char *)runtimePrefs;
  }
  this->rootNode = *(RootNode **)(group_local + 0x10);
  pNVar1 = Node::addChild(*(Node **)(group_local + 8),group);
  this->node = pNVar1;
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( Fl_Preferences *parent, const char *group ) {
  if (parent==0) {
    if (!runtimePrefs) {
      runtimePrefs = new Fl_Preferences();
      runtimePrefs->node = new Node( "." );
      runtimePrefs->rootNode = new RootNode( runtimePrefs );
      runtimePrefs->node->setRoot(rootNode);
    }
    parent = runtimePrefs;
  }
  rootNode = parent->rootNode;
  node = parent->node->addChild( group );
}